

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall
delta_complex_cell_t::assign_filtration
          (delta_complex_cell_t *this,char *filter,delta_complex_t *complex)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  pointer plVar4;
  long *plVar5;
  int iVar6;
  __node_base *p_Var7;
  ostream *poVar8;
  long lVar9;
  size_type sVar10;
  ulong uVar11;
  ulong uVar12;
  int j;
  long lVar13;
  int iVar14;
  float fVar15;
  value_t vVar16;
  float fVar17;
  allocator_type local_31;
  vector<long,_std::allocator<long>_> degrees;
  
  iVar6 = strcmp(filter,"local");
  if (iVar6 == 0) {
    sVar10 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (sVar10 == 2) goto LAB_0011e7ec;
    if (sVar10 != 1) {
      std::vector<long,_std::allocator<long>_>::vector(&degrees,sVar10,&local_31);
      pvVar1 = (this->orientation).
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (this->orientation).
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (lVar9 = 0; lVar9 != ((long)pvVar2 - (long)pvVar1) / 0x18; lVar9 = lVar9 + 1) {
        lVar3 = *(long *)&pvVar1[lVar9].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data;
        plVar4 = *(pointer *)
                  ((long)&pvVar1[lVar9].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (lVar13 = 0; (long)plVar4 - lVar3 >> 3 != lVar13; lVar13 = lVar13 + 1) {
          uVar12 = (ulong)(*(long *)(lVar3 + lVar13 * 8) != 0);
          degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9 + 1] =
               degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9 + 1] + (-uVar12 | 1);
          degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13] =
               degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13] + uVar12 * 2 + -1;
        }
      }
      iVar6 = 0;
      for (; degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_start !=
             degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_finish;
          degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start + 1) {
        iVar6 = (int)((double)iVar6 +
                     (double)*degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start *
                     (double)*degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar14 = (int)((ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
      vVar16 = (value_t)(((iVar14 + -2) * (iVar14 + -1) * iVar14) / 3 + iVar6);
      goto LAB_0011e5e2;
    }
    goto LAB_0011e466;
  }
  iVar6 = strcmp(filter,"global");
  if (iVar6 == 0) {
    plVar5 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)plVar5;
    if (uVar12 == 8) {
      p_Var7 = &(this->in_or_out)._M_h._M_before_begin;
      fVar15 = 0.0;
      while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
        if (((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor == 1.4013e-45) {
          fVar15 = fVar15 + -1.0;
        }
        else if (((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor == 0.0) {
          fVar15 = fVar15 + 1.0;
        }
      }
      fVar15 = fVar15 * fVar15;
    }
    else {
      if ((long)uVar12 < 9) {
        return;
      }
      lVar9 = *(long *)&(((complex->cells).
                          super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        )._M_impl;
      fVar15 = *(float *)(lVar9 + 0x70 + *plVar5 * 0xe8);
      for (uVar11 = 1; uVar11 < uVar12 >> 3; uVar11 = uVar11 + 1) {
        fVar15 = fVar15 + *(float *)(lVar9 + 0x70 + plVar5[uVar11] * 0xe8);
      }
    }
  }
  else {
    iVar6 = strcmp(filter,"vertexMax");
    if (iVar6 == 0) {
      plVar5 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)plVar5;
      if ((long)uVar12 < 9) {
        return;
      }
      lVar9 = *(long *)&(((complex->cells).
                          super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        )._M_impl;
      fVar15 = *(float *)(lVar9 + 0x70 + *plVar5 * 0xe8);
      for (uVar11 = 1; uVar11 < uVar12 >> 3; uVar11 = uVar11 + 1) {
        fVar17 = *(float *)(lVar9 + 0x70 + plVar5[uVar11] * 0xe8);
        if (fVar17 <= fVar15) {
          fVar17 = fVar15;
        }
        fVar15 = fVar17;
      }
    }
    else {
      iVar6 = strcmp(filter,"edgeMax");
      if (iVar6 == 0) {
        plVar5 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)plVar5;
        if ((long)uVar12 < 0x11) {
          return;
        }
        lVar9 = *(long *)&(complex->cells).
                          super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                          ._M_impl;
        fVar15 = *(float *)(lVar9 + 0x70 + *plVar5 * 0xe8);
        for (uVar11 = 1; uVar11 < uVar12 >> 3; uVar11 = uVar11 + 1) {
          fVar17 = *(float *)(lVar9 + 0x70 + plVar5[uVar11] * 0xe8);
          if (fVar17 <= fVar15) {
            fVar17 = fVar15;
          }
          fVar15 = fVar17;
        }
      }
      else {
        iVar6 = strcmp(filter,"vertexSum");
        if (iVar6 == 0) {
          plVar5 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)plVar5;
          if ((long)uVar12 < 9) {
            return;
          }
          lVar9 = *(long *)&(((complex->cells).
                              super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                            )._M_impl;
          fVar15 = *(float *)(lVar9 + 0x70 + *plVar5 * 0xe8);
          for (uVar11 = 1; uVar11 < uVar12 >> 3; uVar11 = uVar11 + 1) {
            fVar15 = fVar15 + *(float *)(lVar9 + 0x70 + plVar5[uVar11] * 0xe8);
          }
        }
        else {
          iVar6 = strcmp(filter,"3cycle");
          if (iVar6 != 0) {
            iVar6 = strcmp(filter,"natural");
            if (iVar6 == 0) {
              sVar10 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              if (sVar10 == 2) goto LAB_0011e7ec;
              if (sVar10 != 1) {
                std::vector<long,_std::allocator<long>_>::vector(&degrees,sVar10,&local_31);
                pvVar1 = (this->orientation).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar2 = (this->orientation).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (lVar9 = 0; lVar9 != ((long)pvVar2 - (long)pvVar1) / 0x18; lVar9 = lVar9 + 1) {
                  lVar3 = *(long *)&pvVar1[lVar9].super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data;
                  plVar4 = *(pointer *)
                            ((long)&pvVar1[lVar9].super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data + 8);
                  for (lVar13 = 0; (long)plVar4 - lVar3 >> 3 != lVar13; lVar13 = lVar13 + 1) {
                    uVar12 = (ulong)(*(long *)(lVar3 + lVar13 * 8) != 0);
                    degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9 + 1] =
                         degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9 + 1] + (-uVar12 | 1);
                    degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] =
                         degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar13] + uVar12 * 2 + -1;
                  }
                }
                iVar6 = 0;
                for (; degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                       degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                    degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start + 1) {
                  iVar6 = (int)((double)iVar6 +
                               (double)*degrees.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_start *
                               (double)*degrees.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                plVar4 = (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                fVar15 = 0.0;
                for (uVar12 = 1;
                    uVar12 < (ulong)((long)(this->boundary).
                                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                           super__Vector_impl_data._M_finish - (long)plVar4 >> 3);
                    uVar12 = uVar12 + 1) {
                  fVar17 = *(float *)(*(long *)&(complex->cells).
                                                super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [((long)(this->vertices).
                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->vertices).
                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 3) +
                                                 -2].
                                                super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                                ._M_impl + 0x70 + plVar4[uVar12] * 0xe8);
                  if (fVar17 <= fVar15) {
                    fVar17 = fVar15;
                  }
                  fVar15 = fVar17;
                }
                vVar16 = (value_t)(int)(fVar15 + (float)iVar6);
                goto LAB_0011e5e2;
              }
            }
            else {
              iVar6 = strcmp(filter,"natural-max");
              if (iVar6 != 0) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "Error no matching filtration found, aborting.");
                std::endl<char,std::char_traits<char>>(poVar8);
                exit(-1);
              }
              sVar10 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              if (sVar10 == 2) {
LAB_0011e7ec:
                this->filt = 2.0;
                return;
              }
              if (sVar10 != 1) {
                std::vector<long,_std::allocator<long>_>::vector(&degrees,sVar10,&local_31);
                pvVar1 = (this->orientation).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar2 = (this->orientation).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (lVar9 = 0; lVar9 != ((long)pvVar2 - (long)pvVar1) / 0x18; lVar9 = lVar9 + 1) {
                  lVar3 = *(long *)&pvVar1[lVar9].super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data;
                  plVar4 = *(pointer *)
                            ((long)&pvVar1[lVar9].super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data + 8);
                  for (lVar13 = 0; (long)plVar4 - lVar3 >> 3 != lVar13; lVar13 = lVar13 + 1) {
                    uVar12 = (ulong)(*(long *)(lVar3 + lVar13 * 8) != 0);
                    degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar9 + 1] =
                         degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9 + 1] + (-uVar12 | 1);
                    degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] =
                         degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar13] + uVar12 * 2 + -1;
                  }
                }
                iVar6 = 0;
                for (; degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                       degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                    degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         degrees.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start + 1) {
                  iVar6 = (int)((double)iVar6 +
                               (double)*degrees.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_start *
                               (double)*degrees.super__Vector_base<long,_std::allocator<long>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                plVar4 = (this->boundary).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                fVar15 = 0.0;
                for (uVar12 = 1;
                    uVar12 < (ulong)((long)(this->boundary).
                                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                           super__Vector_impl_data._M_finish - (long)plVar4 >> 3);
                    uVar12 = uVar12 + 1) {
                  fVar17 = *(float *)(*(long *)&(complex->cells).
                                                super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [((long)(this->vertices).
                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->vertices).
                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 3) +
                                                 -2].
                                                super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                                ._M_impl + 0x70 + plVar4[uVar12] * 0xe8);
                  if (fVar17 <= fVar15) {
                    fVar17 = fVar15;
                  }
                  fVar15 = fVar17;
                }
                iVar14 = (int)fVar15;
                if ((int)fVar15 < iVar6) {
                  iVar14 = iVar6;
                }
                vVar16 = (value_t)iVar14;
LAB_0011e5e2:
                this->filt = vVar16;
                std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                          (&degrees.super__Vector_base<long,_std::allocator<long>_>);
                return;
              }
            }
LAB_0011e466:
            this->filt = 0.0;
            return;
          }
          lVar9 = (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
          if ((lVar9 == 2) || (lVar9 == 1)) goto LAB_0011e466;
          assign_filtration(this,"local",complex);
          iVar14 = (int)((ulong)((long)(this->vertices).
                                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->vertices).
                                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3);
          iVar6 = binom(iVar14,3);
          fVar15 = ((float)(((iVar14 * 4 + -2) / (iVar14 + -2)) * iVar6) - this->filt) * 0.125;
        }
      }
    }
  }
  this->filt = fVar15;
  return;
}

Assistant:

void delta_complex_cell_t::assign_filtration(const char* filter,delta_complex_t* complex){
	if(strcmp(filter,"local") == 0){
		if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 2; }
		else{
			std::vector<index_t> degrees(vertices.size());
			for(int i = 0; i < orientation.size(); i++){
				for(int j = 0; j < orientation[i].size(); j++){
				    if(orientation[i][j] == 0){
						degrees[i+1]++;
						degrees[j]--;
					}
					else{
					   degrees[i+1]--;
					   degrees[j]++;
					}
				}
			}
			int x = 0;
			for(auto i : degrees){ x += pow(i,2); }
			int n = dimension();
			x += ((n+1)*n*(n-1)/3);
			filt = x;
		}
	} else if(strcmp(filter,"global") == 0){
		if(dimension() == 0){
			value_t m = 0;
			for( auto i : in_or_out ){
				if( i.second == 0 ) { m += 1; }
				else if( i.second == 1 ) { m -= 1; }
			}
			filt = pow(m,2);
		} else if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m += complex->cells[0][vertices[i]].filtration();
			}
			filt = m;
		}
	}else if(strcmp(filter,"vertexMax") == 0){
		if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m = std::max(m,complex->cells[0][vertices[i]].filtration());
			}
			filt = m;
		}
	}else if(strcmp(filter,"edgeMax") == 0){
		if(dimension() > 1){
			value_t m = complex->cells[1][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m = std::max(m,complex->cells[1][vertices[i]].filtration());
			}
			filt = m;
		}
	}else if(strcmp(filter,"vertexSum") == 0){
		if(dimension() > 0){
			value_t m = complex->cells[0][vertices[0]].filtration();
			for(int i = 1; i < vertices.size(); i++){
				m += complex->cells[0][vertices[i]].filtration();
			}
			filt = m;
		}
	}else if(strcmp(filter,"3cycle") == 0){
		if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 0; }
		else{
            this->assign_filtration("local",complex);
            int n = dimension()+1;
			filt = (binom(n,3)*((4*n-2)/(n-2)) - filt)/8;
		}
    }else if(strcmp(filter,"natural") == 0){
        if(dimension() == 0){ filt = 0; }
		else if(dimension() == 1){ filt = 2; }
		else{
			std::vector<index_t> degrees(vertices.size());
			for(int i = 0; i < orientation.size(); i++){
				for(int j = 0; j < orientation[i].size(); j++){
				    if(orientation[i][j] == 0){
						degrees[i+1]++;
						degrees[j]--;
					}
					else{
					   degrees[i+1]--;
					   degrees[j]++;
					}
				}
			}
			int x = 0;
			for(auto i : degrees){ x += pow(i,2); }
			value_t max_face = 0;
            for(int i = 1; i < boundary.size(); i++){
                max_face = std::max(max_face,complex->cells[dimension()-1][boundary[i]].filtration());
            }
			x += max_face;
			filt = x;
		}
    }else if(strcmp(filter,"natural-max") == 0){
        if(dimension() == 0){ filt = 0; }
        else if(dimension() == 1){ filt = 2; }
        else{
            std::vector<index_t> degrees(vertices.size());
            for(int i = 0; i < orientation.size(); i++){
                for(int j = 0; j < orientation[i].size(); j++){
                    if(orientation[i][j] == 0){
                        degrees[i+1]++;
                        degrees[j]--;
                    }
                    else{
                       degrees[i+1]--;
                       degrees[j]++;
                    }
                }
            }
            int x = 0;
            for(auto i : degrees){ x += pow(i,2); }
            value_t max_face = 0;
            for(int i = 1; i < boundary.size(); i++){
                max_face = std::max(max_face,complex->cells[dimension()-1][boundary[i]].filtration());
            }
            filt = std::max(x,(int)max_face);
        }
	} else{
		std::cout << "Error no matching filtration found, aborting." << std::endl;
		exit(-1);
	}
}